

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestsessionFixtureLogOn_TimeoutWaitingForLogOnResponse::
~TestsessionFixtureLogOn_TimeoutWaitingForLogOnResponse
          (TestsessionFixtureLogOn_TimeoutWaitingForLogOnResponse *this)

{
  TestsessionFixtureLogOn_TimeoutWaitingForLogOnResponse *this_local;
  
  ~TestsessionFixtureLogOn_TimeoutWaitingForLogOnResponse(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, LogOn_TimeoutWaitingForLogOnResponse) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);
  object->setLogonTimeout(0);

  UtcTimeStamp time;

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->next();

  CHECK(!object->sentLogon());
}